

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  Options post_opts;
  tuple<HttpWrapper::_Error,_HttpWrapper::_Response> ret;
  Options get_opts;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  undefined1 local_1b8 [16];
  _Rb_tree_node_base local_1a8;
  size_t local_188;
  _Rb_tree_node_base local_178;
  size_t local_158;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  local_148 [8];
  _Rb_tree_node_base local_140;
  size_t local_120;
  HttpWrapper local_110 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  tuple<HttpWrapper::_Error,_HttpWrapper::_Response> local_100;
  HttpWrapper local_b8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  Options local_a8;
  
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.url = "http://0.0.0.0:1234/get";
  local_1b8._0_8_ = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a8._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:14:55)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:14:55)>
       ::_M_manager;
  local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8.form._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  call_once<HttpWrapper::request<(HttpWrapper::Methods)0>(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&)::_lambda()_1_>
            ((once_flag *)&HttpWrapper::once,(anon_class_1_0_00000001 *)&local_100);
  HttpWrapper::httpGet(local_b8,&local_a8,(Handler *)local_1b8);
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)((_Any_data *)local_1b8,(_Any_data *)local_1b8,__destroy_functor);
  }
  local_1b8._0_8_ = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a8._M_parent =
       (_Base_ptr)
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/http_wrapper.hpp:198:90)>
       ::_M_invoke;
  local_1a8._0_8_ =
       std::
       _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/http_wrapper.hpp:198:90)>
       ::_M_manager;
  std::
  call_once<HttpWrapper::request<(HttpWrapper::Methods)0>(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&)::_lambda()_1_>
            ((once_flag *)&HttpWrapper::once,(anon_class_1_0_00000001 *)&local_100);
  HttpWrapper::httpGet((HttpWrapper *)local_1f8._M_pod_data,&local_a8,(Handler *)local_1b8);
  std::future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>::get
            (&local_100,
             (future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> *)&local_1f8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
  }
  if ((_Manager_type)local_1a8._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_1a8._0_8_)((_Any_data *)local_1b8,(_Any_data *)local_1b8,__destroy_functor);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,
                      local_100.super__Tuple_impl<0UL,_HttpWrapper::_Error,_HttpWrapper::_Response>.
                      super__Tuple_impl<1UL,_HttpWrapper::_Response>.
                      super__Head_base<1UL,_HttpWrapper::_Response,_false>._M_head_impl.data.
                      _M_dataplus._M_p,
                      local_100.super__Tuple_impl<0UL,_HttpWrapper::_Error,_HttpWrapper::_Response>.
                      super__Tuple_impl<1UL,_HttpWrapper::_Response>.
                      super__Head_base<1UL,_HttpWrapper::_Response,_false>._M_head_impl.data.
                      _M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_1a8._M_left = &local_1a8;
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
  local_1a8._M_parent = (_Base_ptr)0x0;
  local_188 = 0;
  local_178._M_left = &local_178;
  local_178._M_color = _S_red;
  local_178._M_parent = (_Base_ptr)0x0;
  local_158 = 0;
  local_140._M_left = &local_140;
  local_140._M_color = _S_red;
  local_140._M_parent = (_Base_ptr)0x0;
  local_120 = 0;
  local_1b8._0_8_ = "http://0.0.0.0:1234/post";
  local_1a8._M_right = local_1a8._M_left;
  local_178._M_right = local_178._M_left;
  local_140._M_right = local_140._M_left;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_const_char_(&)[6],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1f8,(char (*) [8])"message",(char (*) [6])"hello");
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            (local_148,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1f8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_1f8);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = std::
              _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:31:56)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(const_HttpWrapper::_Error_&,_const_HttpWrapper::_Response_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/UMCTeam[P]http_wrapper/main.cpp:31:56)>
              ::_M_manager;
  HttpWrapper::request<(HttpWrapper::Methods)1>
            (local_110,(Options *)local_1b8,(Handler *)&local_1f8);
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,3);
  }
  do {
    local_1f8._M_unused._M_member_pointer = 1;
    local_1f8._8_8_ = 0;
    do {
      iVar1 = nanosleep((timespec *)&local_1f8,(timespec *)&local_1f8);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  } while( true );
}

Assistant:

int main() {
    //Get请求
    HttpWrapper::Options get_opts;
    get_opts.url = "http://0.0.0.0:1234/get";

    //异步操作
    HttpWrapper::request<HttpWrapper::GET>(get_opts,  [=](const HttpWrapper::Error& error, const HttpWrapper::Response& response) {

        if (!error) {
            cout << response.data << endl;
        }

    });

    //同步操作
    auto ret = HttpWrapper::request<HttpWrapper::GET>(get_opts).get();
    cout << std::get<1>(ret).data << endl;

    //Post 请求
    HttpWrapper::Options post_opts;
    post_opts.url = "http://0.0.0.0:1234/post";
    post_opts.form.insert(pair<string, string>("message", "hello"));

    HttpWrapper::request<HttpWrapper::POST>(post_opts, [=](const HttpWrapper::Error& error, const HttpWrapper::Response& response) {
        cout << response.data << endl;
    });

    while (1) {
        std::this_thread::sleep_for(chrono::seconds(1));
    }

    return 0;
}